

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestHierarchyIterator.cpp
# Opt level: O3

void __thiscall tcu::TestHierarchyIterator::~TestHierarchyIterator(TestHierarchyIterator *this)

{
  TestNodeType TVar1;
  pointer pcVar2;
  long lVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pNVar5;
  
  pNVar5 = (this->m_sessionStack).
           super__Vector_base<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pNVar5 != (this->m_sessionStack).
                super__Vector_base<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    do {
      TVar1 = (pNVar5[-1].node)->m_nodeType;
      if (TVar1 == NODETYPE_PACKAGE) {
        lVar3 = 8;
LAB_00914699:
        (**(code **)((long)this->m_inflater->_vptr_TestHierarchyInflater + lVar3))();
      }
      else if (TVar1 == NODETYPE_GROUP) {
        lVar3 = 0x18;
        goto LAB_00914699;
      }
      pNVar5 = pNVar5 + -1;
    } while (pNVar5 != (this->m_sessionStack).
                       super__Vector_base<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  pcVar2 = (this->m_nodePath)._M_dataplus._M_p;
  paVar4 = &(this->m_nodePath).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
  }
  std::
  vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
  ::~vector(&this->m_sessionStack);
  return;
}

Assistant:

TestHierarchyIterator::~TestHierarchyIterator (void)
{
	// Tear down inflated nodes in m_sessionStack
	for (vector<NodeIter>::reverse_iterator iter = m_sessionStack.rbegin(); iter != m_sessionStack.rend(); ++iter)
	{
		TestNode* const		node		= iter->node;
		const TestNodeType	nodeType	= node->getNodeType();

		switch (nodeType)
		{
			case NODETYPE_ROOT:		/* root is not de-initialized */								break;
			case NODETYPE_PACKAGE:	m_inflater.leaveTestPackage(static_cast<TestPackage*>(node));	break;
			case NODETYPE_GROUP:	m_inflater.leaveGroupNode(static_cast<TestCaseGroup*>(node));	break;
			default:
				break;
		}
	}
}